

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

bool flatbuffers::EscapeString
               (char *s,size_t length,string *_text,bool allow_non_utf8,bool natural_utf8)

{
  byte bVar1;
  uint *puVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  uint *puVar4;
  int iVar5;
  ulong uVar6;
  undefined3 in_register_00000081;
  char *utf8;
  undefined4 local_60;
  undefined4 local_5c;
  ulong local_58;
  string local_50;
  
  local_5c = CONCAT31(in_register_00000081,natural_utf8);
  puVar4 = (uint *)CONCAT71(in_register_00000009,allow_non_utf8);
  local_60 = SUB84(puVar4,0);
  std::__cxx11::string::append((char *)_text);
  local_58 = ~(ulong)s;
  uVar6 = 0;
LAB_0013b558:
  iVar5 = (int)uVar6;
  if (length <= uVar6) {
    std::__cxx11::string::append((char *)_text);
LAB_0013b77c:
    return length <= uVar6;
  }
  bVar1 = s[uVar6];
  puVar2 = &switchD_0013b57f::switchdataD_00194054;
  switch(bVar1) {
  case 8:
    puVar4 = &switchD_0013b57f::switchdataD_00194054;
    break;
  case 9:
    puVar4 = &switchD_0013b57f::switchdataD_00194054;
    break;
  case 10:
    puVar4 = &switchD_0013b57f::switchdataD_00194054;
    break;
  case 0xb:
switchD_0013b57f_caseD_b:
    puVar4 = puVar2;
    if ((byte)(bVar1 - 0x20) < 0x5f) {
      std::__cxx11::string::push_back((char)_text);
    }
    else {
      utf8 = s + uVar6;
      uVar3 = FromUTF8(&utf8);
      if (-1 < (int)uVar3) {
        if ((char)local_5c == '\0') {
          if (uVar3 < 0x10000) {
            std::__cxx11::string::append((char *)_text);
            IntToStringHex_abi_cxx11_(&local_50,(flatbuffers *)(ulong)uVar3,4,(int)puVar4);
            std::__cxx11::string::append((string *)_text);
          }
          else {
            if (0x10ffff < uVar3) goto LAB_0013b760;
            std::__cxx11::string::append((char *)_text);
            IntToStringHex_abi_cxx11_
                      (&local_50,(flatbuffers *)(ulong)((uVar3 - 0x10000 >> 10) + 0xd800),4,
                       (int)puVar4);
            std::__cxx11::string::append((string *)_text);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::append((char *)_text);
            IntToStringHex_abi_cxx11_
                      (&local_50,(flatbuffers *)(ulong)(uVar3 & 0x3ff | 0xdc00),4,(int)puVar4);
            std::__cxx11::string::append((string *)_text);
          }
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          std::__cxx11::string::append((char *)_text,(ulong)(s + uVar6));
        }
LAB_0013b760:
        iVar5 = (int)utf8 + (int)local_58;
        goto LAB_0013b5fa;
      }
      if ((char)local_60 == '\0') goto LAB_0013b77c;
      std::__cxx11::string::append((char *)_text);
      IntToStringHex_abi_cxx11_(&local_50,(flatbuffers *)(ulong)bVar1,2,(int)puVar4);
      std::__cxx11::string::append((string *)_text);
      std::__cxx11::string::~string((string *)&local_50);
    }
    goto LAB_0013b5fa;
  case 0xc:
    puVar4 = &switchD_0013b57f::switchdataD_00194054;
    break;
  case 0xd:
    puVar4 = &switchD_0013b57f::switchdataD_00194054;
    break;
  default:
    if ((bVar1 != 0x22) && (puVar2 = puVar4, bVar1 != 0x5c)) goto switchD_0013b57f_caseD_b;
  }
  std::__cxx11::string::append((char *)_text);
LAB_0013b5fa:
  uVar6 = (ulong)(iVar5 + 1);
  goto LAB_0013b558;
}

Assistant:

inline bool EscapeString(const char *s, size_t length, std::string *_text,
                         bool allow_non_utf8, bool natural_utf8) {
  std::string &text = *_text;
  text += "\"";
  for (uoffset_t i = 0; i < length; i++) {
    char c = s[i];
    switch (c) {
      case '\n': text += "\\n"; break;
      case '\t': text += "\\t"; break;
      case '\r': text += "\\r"; break;
      case '\b': text += "\\b"; break;
      case '\f': text += "\\f"; break;
      case '\"': text += "\\\""; break;
      case '\\': text += "\\\\"; break;
      default:
        if (c >= ' ' && c <= '~') {
          text += c;
        } else {
          // Not printable ASCII data. Let's see if it's valid UTF-8 first:
          const char *utf8 = s + i;
          int ucc = FromUTF8(&utf8);
          if (ucc < 0) {
            if (allow_non_utf8) {
              text += "\\x";
              text += IntToStringHex(static_cast<uint8_t>(c), 2);
            } else {
              // There are two cases here:
              //
              // 1) We reached here by parsing an IDL file. In that case,
              // we previously checked for non-UTF-8, so we shouldn't reach
              // here.
              //
              // 2) We reached here by someone calling GenText()
              // on a previously-serialized flatbuffer. The data might have
              // non-UTF-8 Strings, or might be corrupt.
              //
              // In both cases, we have to give up and inform the caller
              // they have no JSON.
              return false;
            }
          } else {
            if (natural_utf8) {
              // utf8 points to past all utf-8 bytes parsed
              text.append(s + i, static_cast<size_t>(utf8 - s - i));
            } else if (ucc <= 0xFFFF) {
              // Parses as Unicode within JSON's \uXXXX range, so use that.
              text += "\\u";
              text += IntToStringHex(ucc, 4);
            } else if (ucc <= 0x10FFFF) {
              // Encode Unicode SMP values to a surrogate pair using two \u
              // escapes.
              uint32_t base = ucc - 0x10000;
              auto high_surrogate = (base >> 10) + 0xD800;
              auto low_surrogate = (base & 0x03FF) + 0xDC00;
              text += "\\u";
              text += IntToStringHex(high_surrogate, 4);
              text += "\\u";
              text += IntToStringHex(low_surrogate, 4);
            }
            // Skip past characters recognized.
            i = static_cast<uoffset_t>(utf8 - s - 1);
          }
        }
        break;
    }
  }
  text += "\"";
  return true;
}